

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

string * jsonnet::internal::strip_ws(string *__return_storage_ptr__,string *s,uint margin)

{
  byte bVar1;
  pointer pcVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar5 = s->_M_string_length;
  if (uVar5 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (s->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar2,pcVar2);
  }
  else {
    uVar3 = 0;
    do {
      bVar1 = (s->_M_dataplus)._M_p[uVar3];
      uVar4 = uVar3;
      if (((margin <= uVar3) || (0x20 < bVar1)) || ((0x100002200U >> (bVar1 & 0x3f) & 1) == 0))
      break;
      uVar3 = uVar3 + 1;
      uVar4 = uVar5;
    } while (uVar5 != uVar3);
    uVar3 = uVar5;
    if (uVar4 < uVar5) {
      do {
        uVar6 = (ulong)(byte)(s->_M_dataplus)._M_p[uVar5 - 1];
        uVar3 = uVar5;
        if ((0x20 < uVar6) || ((0x100002200U >> (uVar6 & 0x3f) & 1) == 0)) break;
        uVar5 = uVar5 - 1;
        uVar3 = uVar4;
      } while (uVar4 < uVar5);
    }
    pcVar2 = (s->_M_dataplus)._M_p;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar2 + uVar4,pcVar2 + uVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string strip_ws(const std::string &s, unsigned margin)
{
    if (s.size() == 0)
        return s;  // Avoid underflow below.
    size_t i = 0;
    while (i < s.length() && is_horz_ws(s[i]) && i < margin)
        i++;
    size_t j = s.size();
    while (j > i && is_horz_ws(s[j - 1])) {
        j--;
    }
    return std::string(&s[i], &s[j]);
}